

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cpp
# Opt level: O3

void __thiscall Basis::report(Basis *this)

{
  map<int,_BasisStatus,_std::less<int>,_std::allocator<std::pair<const_int,_BasisStatus>_>_>
  *this_00;
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  mapped_type *pmVar4;
  char *pcVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint *puVar9;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  key_type_conflict1 local_70;
  uint local_6c;
  Basis *local_68;
  ulong local_60;
  ulong local_58;
  uint local_4c;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  uVar8 = (this->Atran).num_row;
  uVar1 = (this->Atran).num_col;
  local_40 = (ulong)((long)(this->active_constraint_index).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(this->active_constraint_index).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
  local_48 = (ulong)((long)(this->non_active_constraint_index).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(this->non_active_constraint_index).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
  local_78 = 0;
  local_7c = 0;
  local_80 = 0;
  local_74 = 0;
  local_6c = uVar8;
  local_68 = this;
  if (0 < (int)uVar8) {
    local_74 = 0;
    local_80 = 0;
    local_7c = 0;
    local_78 = 0;
    uVar6 = uVar1;
    do {
      local_4c = uVar6;
      pmVar4 = std::
               map<int,_BasisStatus,_std::less<int>,_std::allocator<std::pair<const_int,_BasisStatus>_>_>
               ::operator[](&this->basisstatus,(key_type_conflict1 *)&local_4c);
      switch(*pmVar4) {
      case kInactive:
        local_74 = local_74 + 1;
        break;
      case kActiveAtLower:
        local_80 = local_80 + 1;
        break;
      case kActiveAtUpper:
        local_7c = local_7c + 1;
        break;
      case kInactiveInBasis:
        local_78 = local_78 + 1;
      }
      uVar6 = uVar6 + 1;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  local_70 = 0;
  local_58 = 0;
  local_60 = 0;
  uVar8 = 0;
  uVar7 = 0;
  if (0 < (int)uVar1) {
    this_00 = &local_68->basisstatus;
    uVar8 = 0;
    local_60 = 0;
    local_58 = 0;
    uVar7 = 0;
    do {
      pmVar4 = std::
               map<int,_BasisStatus,_std::less<int>,_std::allocator<std::pair<const_int,_BasisStatus>_>_>
               ::operator[](this_00,&local_70);
      switch(*pmVar4) {
      case kInactive:
        uVar8 = uVar8 + 1;
        break;
      case kActiveAtLower:
        uVar7 = (ulong)((int)uVar7 + 1);
        break;
      case kActiveAtUpper:
        local_58 = (ulong)((int)local_58 + 1);
        break;
      case kInactiveInBasis:
        local_60 = (ulong)((int)local_60 + 1);
      }
      local_70 = local_70 + 1;
    } while (local_70 < (int)uVar1);
  }
  if ((int)local_48 + (int)local_40 < 100) {
    local_38 = uVar7;
    printf("basis: ");
    puVar2 = (uint *)(local_68->active_constraint_index).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_finish;
    for (puVar9 = (uint *)(local_68->active_constraint_index).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start; puVar9 != puVar2; puVar9 = puVar9 + 1) {
      uVar6 = *puVar9;
      uVar3 = uVar6 - uVar1;
      if ((int)uVar6 < (int)uVar1) {
        pcVar5 = "c%-3d ";
        uVar3 = uVar6;
      }
      else {
        pcVar5 = "v%-3d ";
      }
      printf(pcVar5,(ulong)uVar3);
    }
    printf(" - ");
    puVar2 = (uint *)(local_68->non_active_constraint_index).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_finish;
    for (puVar9 = (uint *)(local_68->non_active_constraint_index).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start; puVar9 != puVar2; puVar9 = puVar9 + 1) {
      uVar6 = *puVar9;
      uVar3 = uVar6 - uVar1;
      if ((int)uVar6 < (int)uVar1) {
        pcVar5 = "c%-3d ";
        uVar3 = uVar6;
      }
      else {
        pcVar5 = "v%-3d ";
      }
      printf(pcVar5,(ulong)uVar3);
    }
    putchar(10);
    uVar7 = local_38;
  }
  printf("Basis::report: QP(%6d [inact %6d; act %6d], %6d)",(ulong)local_6c,local_48,local_40,
         (ulong)uVar1);
  printf(" (inact / lo / up / basis) for var (%6d / %6d / %6d / %6d) and con (%6d / %6d / %6d / %6d)\n"
         ,(ulong)local_74,(ulong)local_80,(ulong)local_7c,(ulong)local_78,(ulong)uVar8,uVar7,
         local_58,local_60);
  return;
}

Assistant:

void Basis::report() {
  //
  // Basis of dimension qp_num_var, analogous to primal simplex
  // nonbasic variables, partitioned into
  //
  // * Indices of active variables/constraints, so index values in {0,
  // * ..., qp_num_con-1}. These are listed in active_constraint_index
  // * and, for each the value of basisstatus will be ActiveAtLower or
  // * ActiveAtUpper
  //
  // * Indices of inactive variables, so index values in {qp_num_con,
  // * ..., qp_num_con+qp_num_var-1} (or possibly also from {0, ...,
  // * qp_num_con-1}?) used to complete the basis. The number of
  // * inactive variables defines the dimension of the null space.
  //
  // Remaining qp_num_con indices may be degenerate, otherwise they
  // are off their bounds. They are analogous to primal simplex basic
  // variables, in that their values are solved for.
  //
  // Hence the correspondence between the QP basis and a HiGHS
  // (simplex) basis is as follows
  //
  // For variables or constraints
  //
  // BasisStatus::kInactive: HighsBasisStatus::kBasic
  //
  // BasisStatus::kActiveAtLower: HighsBasisStatus::kLower
  //
  // BasisStatus::kActiveAtUpper: HighsBasisStatus::kUpper
  //
  // BasisStatus::kInactiveInBasis: HighsBasisStatus::kNonbasic
  //
  //
  const HighsInt qp_num_var = Atran.num_row;
  const HighsInt qp_num_con = Atran.num_col;
  const HighsInt num_active_in_basis = active_constraint_index.size();
  const HighsInt num_inactive_in_basis = non_active_constraint_index.size();

  HighsInt num_var_inactive = 0;
  HighsInt num_var_active_at_lower = 0;
  HighsInt num_var_active_at_upper = 0;
  HighsInt num_var_inactive_in_basis = 0;
  HighsInt num_con_inactive = 0;
  HighsInt num_con_active_at_lower = 0;
  HighsInt num_con_active_at_upper = 0;
  HighsInt num_con_inactive_in_basis = 0;

  for (HighsInt i = 0; i < qp_num_var; i++) {
    switch (basisstatus[qp_num_con + i]) {
      case BasisStatus::kInactive:
        num_var_inactive++;
        continue;
      case BasisStatus::kActiveAtLower:
        num_var_active_at_lower++;
        continue;
      case BasisStatus::kActiveAtUpper:
        num_var_active_at_upper++;
        continue;
      case BasisStatus::kInactiveInBasis:
        num_var_inactive_in_basis++;
        continue;
      default:
        assert(111 == 123);
    }
  }

  for (HighsInt i = 0; i < qp_num_con; i++) {
    switch (basisstatus[i]) {
      case BasisStatus::kInactive:
        num_con_inactive++;
        continue;
      case BasisStatus::kActiveAtLower:
        num_con_active_at_lower++;
        continue;
      case BasisStatus::kActiveAtUpper:
        num_con_active_at_upper++;
        continue;
      case BasisStatus::kInactiveInBasis:
        num_con_inactive_in_basis++;
        continue;
      default:
        assert(111 == 123);
    }
  }

  const bool print_basis = num_inactive_in_basis + num_active_in_basis < 100;
  if (print_basis) {
    printf("basis: ");
    for (HighsInt a_ : active_constraint_index) {
      if (a_ < qp_num_con) {
        printf("c%-3d ", int(a_));
      } else {
        printf("v%-3d ", int(a_ - qp_num_con));
      }
    }
    printf(" - ");
    for (HighsInt n_ : non_active_constraint_index) {
      if (n_ < qp_num_con) {
        printf("c%-3d ", int(n_));
      } else {
        printf("v%-3d ", int(n_ - qp_num_con));
      }
    }
    printf("\n");
  }

  printf("Basis::report: QP(%6d [inact %6d; act %6d], %6d)", int(qp_num_var),
         int(num_inactive_in_basis), int(num_active_in_basis), int(qp_num_con));
  printf(
      " (inact / lo / up / basis) for var (%6d / %6d / %6d / %6d) and con (%6d "
      "/ %6d / %6d / %6d)\n",
      int(num_var_inactive), int(num_var_active_at_lower),
      int(num_var_active_at_upper), int(num_var_inactive_in_basis),
      int(num_con_inactive), int(num_con_active_at_lower),
      int(num_con_active_at_upper), int(num_con_inactive_in_basis));
  assert(qp_num_var == num_inactive_in_basis + num_active_in_basis);
  assert(qp_num_con == num_var_inactive + num_con_inactive);
  assert(num_inactive_in_basis ==
         num_var_inactive_in_basis + num_con_inactive_in_basis);
  assert(num_active_in_basis ==
         num_var_active_at_lower + num_var_active_at_upper +
             num_con_active_at_lower + num_con_active_at_upper);
}